

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libevent-server.c
# Opt level: O2

void readcb(bufferevent *bev,void *ptr)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  
  uVar2 = bufferevent_get_input(*(undefined8 *)((long)ptr + 0x20));
  uVar3 = evbuffer_get_length(uVar2);
  uVar4 = evbuffer_pullup(uVar2,0xffffffffffffffff);
  uVar5 = nghttp2_session_mem_recv2(*(undefined8 *)((long)ptr + 0x30),uVar4,uVar3);
  if ((long)uVar5 < 0) {
    uVar2 = nghttp2_strerror(uVar5 & 0xffffffff);
    warnx("Fatal error: %s",uVar2);
  }
  else {
    iVar1 = evbuffer_drain(uVar2,uVar5);
    if (iVar1 == 0) {
      iVar1 = session_send((http2_session_data *)ptr);
      if (iVar1 == 0) {
        return;
      }
    }
    else {
      warnx("Fatal error: evbuffer_drain failed");
    }
  }
  delete_http2_session_data((http2_session_data *)ptr);
  return;
}

Assistant:

static void readcb(struct bufferevent *bev, void *ptr) {
  http2_session_data *session_data = (http2_session_data *)ptr;
  (void)bev;

  if (session_recv(session_data) != 0) {
    delete_http2_session_data(session_data);
    return;
  }
}